

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void trim_leading_zeroes(char *buf,size_t bufsize,size_t maxtrim)

{
  byte bVar1;
  byte bVar2;
  size_t logd;
  size_t sVar3;
  size_t trim;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  
  if (maxtrim == 0) {
    maxtrim = 0;
  }
  else {
    for (sVar3 = maxtrim - 1; sVar3 != 0xffffffffffffffff; sVar3 = sVar3 - 1) {
      if (buf[sVar3] != '0') {
        maxtrim = sVar3;
      }
    }
  }
  for (bVar2 = 0; bufsize >> (bVar2 & 0x3f) != 0; bVar2 = bVar2 + 1) {
    uVar4 = 1L << (bVar2 & 0x3f);
    for (lVar5 = 0; uVar4 + lVar5 < bufsize; lVar5 = lVar5 + 1) {
      bVar1 = buf[lVar5 + uVar4];
      bVar6 = bVar1 ^ buf[lVar5];
      if ((uVar4 & maxtrim) == 0) {
        bVar6 = 0;
      }
      buf[lVar5] = buf[lVar5] ^ bVar6;
      buf[lVar5 + uVar4] = bVar6 ^ bVar1;
    }
  }
  return;
}

Assistant:

static void trim_leading_zeroes(char *buf, size_t bufsize, size_t maxtrim)
{
    size_t trim = maxtrim;

    /*
     * Look for the first character not equal to '0', to find the
     * shift count.
     */
    if (trim > 0) {
        for (size_t pos = trim; pos-- > 0 ;) {
            uint8_t diff = buf[pos] ^ '0';
            size_t mask = -((((size_t)diff) - 1) >> (SIZE_T_BITS - 1));
            trim ^= (trim ^ pos) & ~mask;
        }
    }

    /*
     * Now do the shift, in log n passes each of which does a
     * conditional shift by 2^i bytes if bit i is set in the shift
     * count.
     */
    uint8_t *ubuf = (uint8_t *)buf;
    for (size_t logd = 0; bufsize >> logd; logd++) {
        uint8_t mask = -(uint8_t)((trim >> logd) & 1);
        size_t d = (size_t)1 << logd;
        for (size_t i = 0; i+d < bufsize; i++) {
            uint8_t diff = mask & (ubuf[i] ^ ubuf[i+d]);
            ubuf[i] ^= diff;
            ubuf[i+d] ^= diff;
        }
    }
}